

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O1

bool __thiscall
HeadersSyncState::ValidateAndStoreHeadersCommitments
          (HeadersSyncState *this,vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers)

{
  long lVar1;
  pointer pCVar2;
  CBlockHeader *pCVar3;
  CBlockIndex *pCVar4;
  uint256 *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  Logger *pLVar13;
  int i;
  long lVar14;
  CBlockHeader *current;
  long in_FS_OFFSET;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  char *fmt;
  uchar in_stack_ffffffffffffffa8;
  uchar in_stack_ffffffffffffffa9;
  uchar in_stack_ffffffffffffffaa;
  uchar in_stack_ffffffffffffffab;
  uchar in_stack_ffffffffffffffac;
  uchar in_stack_ffffffffffffffad;
  uchar in_stack_ffffffffffffffae;
  uchar in_stack_ffffffffffffffaf;
  uchar in_stack_ffffffffffffffb0;
  uchar in_stack_ffffffffffffffb1;
  uchar in_stack_ffffffffffffffb2;
  uchar in_stack_ffffffffffffffb3;
  uchar in_stack_ffffffffffffffb4;
  uchar in_stack_ffffffffffffffb5;
  uchar in_stack_ffffffffffffffb6;
  uchar in_stack_ffffffffffffffb7;
  uchar in_stack_ffffffffffffffb8;
  uchar in_stack_ffffffffffffffb9;
  uchar in_stack_ffffffffffffffba;
  uchar in_stack_ffffffffffffffbb;
  uchar in_stack_ffffffffffffffbc;
  uchar in_stack_ffffffffffffffbd;
  uchar in_stack_ffffffffffffffbe;
  uchar in_stack_ffffffffffffffbf;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar10 = true;
  if ((headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
      super__Vector_impl_data._M_finish == pCVar2) goto LAB_00470d9d;
  if (this->m_download_state == PRESYNC) {
    CBlockHeader::GetHash((uint256 *)&stack0xffffffffffffffa8,&this->m_last_header_received);
    auVar17[0] = -(in_stack_ffffffffffffffa8 ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0]);
    auVar17[1] = -(in_stack_ffffffffffffffa9 ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1]);
    auVar17[2] = -(in_stack_ffffffffffffffaa ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2]);
    auVar17[3] = -(in_stack_ffffffffffffffab ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3]);
    auVar17[4] = -(in_stack_ffffffffffffffac ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[4]);
    auVar17[5] = -(in_stack_ffffffffffffffad ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[5]);
    auVar17[6] = -(in_stack_ffffffffffffffae ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[6]);
    auVar17[7] = -(in_stack_ffffffffffffffaf ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[7]);
    auVar17[8] = -(in_stack_ffffffffffffffb0 ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[8]);
    auVar17[9] = -(in_stack_ffffffffffffffb1 ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[9]);
    auVar17[10] = -(in_stack_ffffffffffffffb2 ==
                   (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[10]);
    auVar17[0xb] = -(in_stack_ffffffffffffffb3 ==
                    (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar17[0xc] = -(in_stack_ffffffffffffffb4 ==
                    (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar17[0xd] = -(in_stack_ffffffffffffffb5 ==
                    (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar17[0xe] = -(in_stack_ffffffffffffffb6 ==
                    (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar17[0xf] = -(in_stack_ffffffffffffffb7 ==
                    (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar16[0] = -(in_stack_ffffffffffffffb8 ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar16[1] = -(in_stack_ffffffffffffffb9 ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar16[2] = -(in_stack_ffffffffffffffba ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar16[3] = -(in_stack_ffffffffffffffbb ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar16[4] = -(in_stack_ffffffffffffffbc ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar16[5] = -(in_stack_ffffffffffffffbd ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar16[6] = -(in_stack_ffffffffffffffbe ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar16[7] = -(in_stack_ffffffffffffffbf ==
                  (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar16[8] = -(uStack_40 == (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x18])
    ;
    auVar16[9] = -(uStack_3f == (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x19])
    ;
    auVar16[10] = -(uStack_3e == (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1a]
                   );
    auVar16[0xb] = -(uStack_3d ==
                    (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar16[0xc] = -(uStack_3c ==
                    (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar16[0xd] = -(uStack_3b ==
                    (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar16[0xe] = -(uStack_3a ==
                    (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar16[0xf] = -(uStack_39 ==
                    (pCVar2->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar16 = auVar16 & auVar17;
    iVar9 = (int)this;
    if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff) {
      current = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pCVar3 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      bVar15 = current == pCVar3;
      if (!bVar15) {
        bVar11 = ValidateAndProcessSingleHeader(this,current);
        if (bVar11) {
          do {
            current = current + 1;
            bVar15 = current == pCVar3;
            if (bVar15) goto LAB_00470eaf;
            bVar11 = ValidateAndProcessSingleHeader(this,current);
          } while (bVar11);
        }
        if (!bVar15) goto LAB_00470d9b;
      }
LAB_00470eaf:
      iVar12 = base_uint<256U>::CompareTo
                         (&(this->m_current_chain_work).super_base_uint<256U>,
                          &(this->m_minimum_required_work).super_base_uint<256U>);
      if (-1 < iVar12) {
        std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::clear
                  (&this->m_redownloaded_headers);
        pCVar4 = this->m_chain_start;
        this->m_redownload_buffer_last_height = (long)pCVar4->nHeight;
        puVar5 = pCVar4->phashBlock;
        if (puVar5 != (uint256 *)0x0) {
          uVar6 = *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
          uVar7 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
          uVar8 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
          *(undefined8 *)
           ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 0x10
           ) = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
          *(undefined8 *)
           ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 0x18
           ) = uVar8;
          *(undefined8 *)
           (this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems = uVar6
          ;
          *(undefined8 *)
           ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 8) =
               uVar7;
          puVar5 = pCVar4->phashBlock;
          if (puVar5 != (uint256 *)0x0) {
            uVar6 = *(undefined8 *)(puVar5->super_base_blob<256U>).m_data._M_elems;
            uVar7 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 8);
            uVar8 = *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x18);
            *(undefined8 *)
             ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
                 *(undefined8 *)((puVar5->super_base_blob<256U>).m_data._M_elems + 0x10);
            *(undefined8 *)
             ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
                 uVar8;
            *(undefined8 *)
             (this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems = uVar6;
            *(undefined8 *)
             ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 8) =
                 uVar7;
            if (&this->m_redownload_chain_work != &pCVar4->nChainWork) {
              lVar14 = 0;
              do {
                (this->m_redownload_chain_work).super_base_uint<256U>.pn[lVar14] =
                     (pCVar4->nChainWork).super_base_uint<256U>.pn[lVar14];
                lVar14 = lVar14 + 1;
              } while (lVar14 != 8);
            }
            this->m_download_state = REDOWNLOAD;
            pLVar13 = LogInstance();
            fmt = (char *)0x470f70;
            bVar15 = BCLog::Logger::WillLogCategoryLevel(pLVar13,NET,Debug);
            if (bVar15) {
              logging_function_00._M_str = "ValidateAndStoreHeadersCommitments";
              logging_function_00._M_len = 0x22;
              source_file_00._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/headerssync.cpp"
              ;
              source_file_00._M_len = 0x58;
              LogPrintf_<long,long,long>
                        (logging_function_00,source_file_00,iVar9 + 8,
                         (LogFlags)&this->m_current_height,iVar9 + 0x178,fmt,
                         (long *)CONCAT17(in_stack_ffffffffffffffaf,
                                          CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT15(in_stack_ffffffffffffffad,
                                                            CONCAT14(in_stack_ffffffffffffffac,
                                                                     CONCAT13(
                                                  in_stack_ffffffffffffffab,
                                                  CONCAT12(in_stack_ffffffffffffffaa,
                                                           CONCAT11(in_stack_ffffffffffffffa9,
                                                                    in_stack_ffffffffffffffa8)))))))
                         ,(long *)CONCAT17(in_stack_ffffffffffffffb7,
                                           CONCAT16(in_stack_ffffffffffffffb6,
                                                    CONCAT15(in_stack_ffffffffffffffb5,
                                                             CONCAT14(in_stack_ffffffffffffffb4,
                                                                      CONCAT13(
                                                  in_stack_ffffffffffffffb3,
                                                  CONCAT12(in_stack_ffffffffffffffb2,
                                                           CONCAT11(in_stack_ffffffffffffffb1,
                                                                    in_stack_ffffffffffffffb0)))))))
                         ,(long *)CONCAT17(in_stack_ffffffffffffffbf,
                                           CONCAT16(in_stack_ffffffffffffffbe,
                                                    CONCAT15(in_stack_ffffffffffffffbd,
                                                             CONCAT14(in_stack_ffffffffffffffbc,
                                                                      CONCAT13(
                                                  in_stack_ffffffffffffffbb,
                                                  CONCAT12(in_stack_ffffffffffffffba,
                                                           CONCAT11(in_stack_ffffffffffffffb9,
                                                                    in_stack_ffffffffffffffb8)))))))
                        );
            }
            goto LAB_00470d9d;
          }
        }
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      goto LAB_00470d9d;
    }
    pLVar13 = LogInstance();
    bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar13,NET,Debug);
    if (bVar10) {
      logging_function._M_str = "ValidateAndStoreHeadersCommitments";
      logging_function._M_len = 0x22;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/headerssync.cpp"
      ;
      source_file._M_len = 0x58;
      LogPrintf_<long,long>
                (logging_function,source_file,0x9a,
                 IPC|COINDB|MEMPOOLREJ|PRUNE|ESTIMATEFEE|RPC|WALLETDB|BENCH|MEMPOOL|TOR|NET,
                 iVar9 + 8,(char *)&this->m_current_height,
                 (long *)CONCAT17(in_stack_ffffffffffffffaf,
                                  CONCAT16(in_stack_ffffffffffffffae,
                                           CONCAT15(in_stack_ffffffffffffffad,
                                                    CONCAT14(in_stack_ffffffffffffffac,
                                                             CONCAT13(in_stack_ffffffffffffffab,
                                                                      CONCAT12(
                                                  in_stack_ffffffffffffffaa,
                                                  CONCAT11(in_stack_ffffffffffffffa9,
                                                           in_stack_ffffffffffffffa8))))))),
                 (long *)CONCAT17(in_stack_ffffffffffffffb7,
                                  CONCAT16(in_stack_ffffffffffffffb6,
                                           CONCAT15(in_stack_ffffffffffffffb5,
                                                    CONCAT14(in_stack_ffffffffffffffb4,
                                                             CONCAT13(in_stack_ffffffffffffffb3,
                                                                      CONCAT12(
                                                  in_stack_ffffffffffffffb2,
                                                  CONCAT11(in_stack_ffffffffffffffb1,
                                                           in_stack_ffffffffffffffb0))))))));
    }
  }
LAB_00470d9b:
  bVar10 = false;
LAB_00470d9d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar10;
}

Assistant:

bool HeadersSyncState::ValidateAndStoreHeadersCommitments(const std::vector<CBlockHeader>& headers)
{
    // The caller should not give us an empty set of headers.
    Assume(headers.size() > 0);
    if (headers.size() == 0) return true;

    Assume(m_download_state == State::PRESYNC);
    if (m_download_state != State::PRESYNC) return false;

    if (headers[0].hashPrevBlock != m_last_header_received.GetHash()) {
        // Somehow our peer gave us a header that doesn't connect.
        // This might be benign -- perhaps our peer reorged away from the chain
        // they were on. Give up on this sync for now (likely we will start a
        // new sync with a new starting point).
        LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: non-continuous headers at height=%i (presync phase)\n", m_id, m_current_height);
        return false;
    }

    // If it does connect, (minimally) validate and occasionally store
    // commitments.
    for (const auto& hdr : headers) {
        if (!ValidateAndProcessSingleHeader(hdr)) {
            return false;
        }
    }

    if (m_current_chain_work >= m_minimum_required_work) {
        m_redownloaded_headers.clear();
        m_redownload_buffer_last_height = m_chain_start->nHeight;
        m_redownload_buffer_first_prev_hash = m_chain_start->GetBlockHash();
        m_redownload_buffer_last_hash = m_chain_start->GetBlockHash();
        m_redownload_chain_work = m_chain_start->nChainWork;
        m_download_state = State::REDOWNLOAD;
        LogDebug(BCLog::NET, "Initial headers sync transition with peer=%d: reached sufficient work at height=%i, redownloading from height=%i\n", m_id, m_current_height, m_redownload_buffer_last_height);
    }
    return true;
}